

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::TagNotDefinedForMessage::TagNotDefinedForMessage
          (TagNotDefinedForMessage *this,int field,string *what)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *what_local;
  TagNotDefinedForMessage *pTStack_10;
  int field_local;
  TagNotDefinedForMessage *this_local;
  
  local_20 = what;
  what_local._4_4_ = field;
  pTStack_10 = this;
  std::__cxx11::to_string(&local_60,field);
  std::operator+(&local_40,"Tag not defined for this message type: ",&local_60);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)&this->super_Exception = &PTR__TagNotDefinedForMessage_0032f900;
  this->field = what_local._4_4_;
  return;
}

Assistant:

TagNotDefinedForMessage(int field = 0, const std::string &what = "")
      : Exception("Tag not defined for this message type: " + std::to_string(field), what),
        field(field) {}